

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void ctx_modules_undo_backlinks(ly_ctx *ctx,ly_set *mods)

{
  lys_module *plVar1;
  int iVar2;
  lys_node_leaf *leaf;
  lys_node *next;
  lys_node *elem;
  lys_module *mod;
  uint v;
  uint u;
  uint8_t j;
  int o;
  ly_set *mods_local;
  ly_ctx *ctx_local;
  
  for (u = 4; (int)u < (ctx->models).used; u = u + 1) {
    plVar1 = (ctx->models).list[(int)u];
    for (v._3_1_ = 0; v._3_1_ < plVar1->features_size; v._3_1_ = v._3_1_ + 1) {
      if (plVar1->features[v._3_1_].depfeatures != (ly_set *)0x0) {
        for (mod._0_4_ = 0; (uint)mod < (plVar1->features[v._3_1_].depfeatures)->number;
            mod._0_4_ = (uint)mod + 1) {
          if ((mods == (ly_set *)0x0) ||
             (iVar2 = ly_set_contains(mods,((plVar1->features[v._3_1_].depfeatures)->set).s
                                           [(uint)mod]->module), iVar2 != -1)) {
            ly_set_rm_index(plVar1->features[v._3_1_].depfeatures,(uint)mod);
            mod._0_4_ = (uint)mod - 1;
          }
        }
        if ((plVar1->features[v._3_1_].depfeatures)->number == 0) {
          ly_set_free(plVar1->features[v._3_1_].depfeatures);
          plVar1->features[v._3_1_].depfeatures = (ly_set *)0x0;
        }
      }
    }
    for (mod._4_4_ = 0; mod._4_4_ < plVar1->ident_size; mod._4_4_ = mod._4_4_ + 1) {
      if (plVar1->ident[mod._4_4_].der != (ly_set *)0x0) {
        for (mod._0_4_ = 0; (uint)mod < (plVar1->ident[mod._4_4_].der)->number;
            mod._0_4_ = (uint)mod + 1) {
          if ((mods == (ly_set *)0x0) ||
             (iVar2 = ly_set_contains(mods,((plVar1->ident[mod._4_4_].der)->set).s[(uint)mod]->
                                           module), iVar2 != -1)) {
            ly_set_rm_index(plVar1->ident[mod._4_4_].der,(uint)mod);
            mod._0_4_ = (uint)mod - 1;
          }
        }
        if ((plVar1->ident[mod._4_4_].der)->number == 0) {
          ly_set_free(plVar1->ident[mod._4_4_].der);
          plVar1->ident[mod._4_4_].der = (ly_set *)0x0;
        }
      }
    }
    next = plVar1->data;
    while (next != (lys_node *)0x0) {
      if (((next->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
         (next->child != (lys_node *)0x0)) {
        if (mods == (ly_set *)0x0) {
          ly_set_free((ly_set *)next->child);
          next->child = (lys_node *)0x0;
        }
        else {
          for (mod._0_4_ = 0; (uint)mod < *(uint *)((long)&next->child->name + 4);
              mod._0_4_ = (uint)mod + 1) {
            iVar2 = ly_set_contains(mods,*(void **)(*(long *)(next->child->dsc +
                                                             (ulong)(uint)mod * 8) + 0x30));
            if (iVar2 != -1) {
              ly_set_rm_index((ly_set *)next->child,(uint)mod);
              mod._0_4_ = (uint)mod - 1;
            }
          }
          if (*(int *)((long)&next->child->name + 4) == 0) {
            ly_set_free((ly_set *)next->child);
            next->child = (lys_node *)0x0;
          }
        }
      }
      leaf = (lys_node_leaf *)next->child;
      if ((next->nodetype & 0x882c) != LYS_UNKNOWN) {
        leaf = (lys_node_leaf *)0x0;
      }
      if (leaf == (lys_node_leaf *)0x0) {
        leaf = (lys_node_leaf *)next->next;
      }
      while ((leaf == (lys_node_leaf *)0x0 && (next = lys_parent(next), next != (lys_node *)0x0))) {
        leaf = (lys_node_leaf *)next->next;
      }
      next = (lys_node *)leaf;
    }
  }
  return;
}

Assistant:

static void
ctx_modules_undo_backlinks(struct ly_ctx *ctx, struct ly_set *mods)
{
    int o;
    uint8_t j;
    unsigned int u, v;
    struct lys_module *mod;
    struct lys_node *elem, *next;
    struct lys_node_leaf *leaf;

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    for (o = INTERNAL_MODULES_COUNT - 1; o < ctx->models.used; o++) {
        mod = ctx->models.list[o]; /* shortcut */

        /* 1) features */
        for (j = 0; j < mod->features_size; j++) {
            if (!mod->features[j].depfeatures) {
                continue;
            }
            for (v = 0; v < mod->features[j].depfeatures->number; v++) {
                if (!mods || ly_set_contains(mods, ((struct lys_feature *)mod->features[j].depfeatures->set.g[v])->module) != -1) {
                    /* depending feature is in module to remove */
                    ly_set_rm_index(mod->features[j].depfeatures, v);
                    v--;
                }
            }
            if (!mod->features[j].depfeatures->number) {
                /* all backlinks removed */
                ly_set_free(mod->features[j].depfeatures);
                mod->features[j].depfeatures = NULL;
            }
        }

        /* 2) identities */
        for (u = 0; u < mod->ident_size; u++) {
            if (!mod->ident[u].der) {
                continue;
            }
            for (v = 0; v < mod->ident[u].der->number; v++) {
                if (!mods || ly_set_contains(mods, ((struct lys_ident *)mod->ident[u].der->set.g[v])->module) != -1) {
                    /* derived identity is in module to remove */
                    ly_set_rm_index(mod->ident[u].der, v);
                    v--;
                }
            }
            if (!mod->ident[u].der->number) {
                /* all backlinks removed */
                ly_set_free(mod->ident[u].der);
                mod->ident[u].der = NULL;
            }
        }

        /* 3) leafrefs */
        for (elem = next = mod->data; elem; elem = next) {
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                leaf = (struct lys_node_leaf *)elem; /* shortcut */
                if (leaf->backlinks) {
                    if (!mods) {
                        /* remove all backlinks */
                        ly_set_free(leaf->backlinks);
                        leaf->backlinks = NULL;
                    } else {
                        for (v = 0; v < leaf->backlinks->number; v++) {
                            if (ly_set_contains(mods, leaf->backlinks->set.s[v]->module) != -1) {
                                /* derived identity is in module to remove */
                                ly_set_rm_index(leaf->backlinks, v);
                                v--;
                            }
                        }
                        if (!leaf->backlinks->number) {
                            /* all backlinks removed */
                            ly_set_free(leaf->backlinks);
                            leaf->backlinks = NULL;
                        }
                    }
                }
            }

            /* select next element to process */
            next = elem->child;
            /* child exception for leafs, leaflists, anyxml and groupings */
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA | LYS_GROUPING)) {
                next = NULL;
            }
            if (!next) {
                /* no children,  try siblings */
                next = elem->next;
            }
            while (!next) {
                /* parent is already processed, go to its sibling */
                elem = lys_parent(elem);
                if (!elem) {
                    /* we are done, no next element to process */
                    break;
                }
                /* no siblings, go back through parents */
                next = elem->next;
            }
        }
    }
}